

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O0

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
ResponseBase::extractStdTokensFromLine
          (set<Token,_std::less<Token>,_std::allocator<Token>_> *__return_storage_ptr__,
          ResponseBase *this,string *line)

{
  int iVar1;
  size_type sVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  string local_118;
  Token local_f8;
  string local_d0 [8];
  string tokenValue;
  set<Token,_std::less<Token>,_std::allocator<Token>_> subSet;
  string templateContent;
  size_t templateEnd;
  size_t tokenEnd;
  size_t tokenBegin;
  undefined1 local_30 [8];
  string_view tokenStartString;
  string *line_local;
  ResponseBase *this_local;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *tokens;
  
  tokenStartString._M_str = (char *)line;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_30,"std::");
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::set(__return_storage_ptr__);
  tokenEnd = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                       ((string *)tokenStartString._M_str,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_30,0);
  do {
    if (tokenEnd == 0xffffffffffffffff) {
      return __return_storage_ptr__;
    }
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    templateEnd = tokenEnd + sVar2;
    while (uVar3 = std::__cxx11::string::length(), templateEnd < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)tokenStartString._M_str);
      iVar1 = isalnum((int)*pcVar4);
      if (iVar1 == 0) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)tokenStartString._M_str);
        if (*pcVar4 == '_') {
          templateEnd = templateEnd + 1;
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)tokenStartString._M_str);
          if (((*pcVar4 == ':') && (uVar3 = std::__cxx11::string::length(), templateEnd + 1 < uVar3)
              ) && (pcVar4 = (char *)std::__cxx11::string::operator[]
                                               ((ulong)tokenStartString._M_str), *pcVar4 == ':')) {
            templateEnd = templateEnd + 2;
          }
          else {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)tokenStartString._M_str);
            if ((*pcVar4 != '<') ||
               (sVar5 = braceEnd((string *)tokenStartString._M_str,templateEnd,'<','>'),
               sVar5 == 0xffffffffffffffff)) break;
            std::__cxx11::string::substr
                      ((ulong)&subSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (ulong)tokenStartString._M_str);
            extractStdTokensFromLine
                      ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)
                       ((long)&tokenValue.field_2 + 8),this,
                       (string *)&subSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
            moveInsert<Token>((set<Token,_std::less<Token>,_std::allocator<Token>_> *)
                              ((long)&tokenValue.field_2 + 8),__return_storage_ptr__);
            templateEnd = sVar5 + 1;
            std::set<Token,_std::less<Token>,_std::allocator<Token>_>::~set
                      ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)
                       ((long)&tokenValue.field_2 + 8));
            std::__cxx11::string::~string
                      ((string *)&subSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
        }
      }
      else {
        templateEnd = templateEnd + 1;
      }
    }
    std::__cxx11::string::substr((ulong)local_d0,(ulong)tokenStartString._M_str);
    pcVar4 = (char *)std::__cxx11::string::back();
    if (*pcVar4 != ':') {
      std::__cxx11::string::string((string *)&local_118,local_d0);
      Token::Token(&local_f8,&local_118);
      std::set<Token,_std::less<Token>,_std::allocator<Token>_>::insert
                (__return_storage_ptr__,&local_f8);
      Token::~Token(&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
    tokenEnd = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                         ((string *)tokenStartString._M_str,
                          (basic_string_view<char,_std::char_traits<char>_> *)local_30,templateEnd);
    std::__cxx11::string::~string(local_d0);
  } while( true );
}

Assistant:

std::set<Token> extractStdTokensFromLine(const std::string& line) const {
        const std::string_view tokenStartString = "std::";

        std::set<Token> tokens;

        size_t tokenBegin = line.find(tokenStartString);
        while (tokenBegin != std::string::npos) {
            size_t tokenEnd = tokenBegin + tokenStartString.length();

            while (tokenEnd < line.length()) {
                if (std::isalnum(line[tokenEnd])) {
                    tokenEnd++;
                } else if (line[tokenEnd] == '_') {
                    tokenEnd++;
                } else if ((line[tokenEnd] == ':') and (tokenEnd + 1 < line.length()) and (line[tokenEnd + 1] == ':')) {
                    tokenEnd += 2;
                } else if (line[tokenEnd] == '<') {
                    const size_t templateEnd = braceEnd(line, tokenEnd, '<', '>');
                    if (templateEnd == std::string::npos) {
                        break;
                    }

                    const std::string templateContent = line.substr(tokenEnd + 1, templateEnd - tokenEnd);
                    std::set<Token> subSet = extractStdTokensFromLine(templateContent);
                    moveInsert(std::move(subSet), tokens);
                    tokenEnd = templateEnd + 1;
                } else {
                    break;
                }
            }

            std::string tokenValue = line.substr(tokenBegin, tokenEnd - tokenBegin);
            if (tokenValue.back() != ':') {
                tokens.insert(Token(std::move(tokenValue)));
            }

            tokenBegin = line.find(tokenStartString, tokenEnd);
        }

        return tokens;
    }